

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O0

int cvLsPrecSetupBWrapper
              (sunrealtype t,N_Vector yB,N_Vector fyB,int jokB,int *jcurPtrB,sunrealtype gammaB,
              void *cvode_mem)

{
  int iVar1;
  undefined8 in_RCX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int retval;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  CVodeMem cv_mem;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  CVadjMem *in_stack_ffffffffffffffa0;
  CVodeMem *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  CVodeMem in_stack_ffffffffffffffb8;
  int local_4;
  
  local_4 = cvLs_AccessLMemBCur(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,
                                in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                                (CVodeBMem *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                (CVLsMemB *)0x13e46d);
  if (local_4 == 0) {
    iVar1 = (**(code **)(in_stack_ffffffffffffffb0 + 0xa8))
                      (in_XMM0_Qa,in_stack_ffffffffffffffb8,
                       *(undefined8 *)(in_stack_ffffffffffffffb0 + 0x1f8),0);
    if (iVar1 == 0) {
      local_4 = (*(code *)in_stack_ffffffffffffffa0[8])
                          (in_XMM0_Qa,in_XMM1_Qa,*(undefined8 *)(in_stack_ffffffffffffffb0 + 0x1f8),
                           in_RDI,in_RSI,in_EDX,in_RCX,in_stack_ffffffffffffffa8[8]);
    }
    else {
      cvProcessError(in_stack_ffffffffffffffb8,-1,0x9df,"cvLsPrecSetupBWrapper",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int cvLsPrecSetupBWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                                 sunbooleantype jokB, sunbooleantype* jcurPtrB,
                                 sunrealtype gammaB, void* cvode_mem)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsPrecSetupBWrapper", &cv_mem,
                               &ca_mem, &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Get forward solution from interpolation */
  retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL);
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint precondB routine */
  return (cvlsB_mem->psetB(t, ca_mem->ca_ytmp, yB, fyB, jokB, jcurPtrB, gammaB,
                           cvB_mem->cv_user_data));
}